

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O1

void test_dt_decimal(void)

{
  char cVar1;
  XSValue_Data expValue;
  XSValue_Data expValue_00;
  XSValue_Data expValue_01;
  char cVar2;
  bool bVar3;
  XSValue_Data *pXVar4;
  XSValue *pXVar5;
  wchar16 *pwVar6;
  char *pcVar7;
  long lVar8;
  void *pvVar9;
  char *pcVar10;
  int iVar11;
  Status myStatus;
  Status myStatus_12;
  char lex_iv_1 [10];
  char data_canrep_7 [6];
  char lex_iv_2 [12];
  char data_canrep_5 [7];
  char data_canrep_4 [7];
  char data_canrep_2 [7];
  char data_rawstr_3 [6];
  char data_rawstr_7 [7];
  char data_canrep_6 [8];
  char data_canrep_3 [8];
  char data_canrep_1 [8];
  char data_rawstr_6 [9];
  char data_rawstr_5 [10];
  char data_rawstr_4 [10];
  char data_rawstr_2 [8];
  char lex_v_ran64_v_2 [25];
  char lex_v_ran64_v_1 [25];
  char lex_v_ran64_iv_1 [25];
  char data_rawstr_1 [13];
  char lex_v_ran_v_1 [14];
  char lex_v_ran64_iv_2 [25];
  StrX local_258;
  char *local_248;
  Status local_23c;
  char local_238 [16];
  char local_228 [8];
  char local_220 [16];
  char local_210 [8];
  char local_208 [8];
  char local_200 [8];
  char local_1f8 [8];
  char local_1f0 [8];
  char local_1e8 [8];
  undefined8 local_1e0;
  char local_1d8 [8];
  undefined8 local_1d0;
  undefined1 local_1c8;
  char local_1c0 [16];
  char local_1b0 [16];
  char local_1a0 [8];
  undefined8 local_198;
  undefined1 uStack_190;
  undefined7 local_18f;
  undefined1 uStack_188;
  char acStack_187 [15];
  char local_178 [32];
  char local_158 [32];
  char local_138 [16];
  char local_128 [16];
  char local_118 [40];
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  builtin_strncpy(local_128 + 8,"67  \n",6);
  builtin_strncpy(local_128,"  1234.5",8);
  builtin_strncpy(local_178 + 0x10,"1615.999",9);
  builtin_strncpy(local_178,"1844674407370955",0x10);
  uStack_188 = 0x30;
  builtin_strncpy(acStack_187,"9551615",8);
  local_198 = 0x343438312e393939;
  uStack_190 = 0x36;
  local_18f = 0x37333730343437;
  builtin_strncpy(local_158 + 0x10,"1616.999",9);
  builtin_strncpy(local_158,"1844674407370955",0x10);
  builtin_strncpy(local_118 + 0x10,"09551616",9);
  builtin_strncpy(local_118,"999.184467440737",0x10);
  builtin_strncpy(local_238,"12b34.456",10);
  builtin_strncpy(local_220,"1234.56.789",0xc);
  builtin_strncpy(local_138 + 8,"5  \n",5);
  builtin_strncpy(local_138,"  -123.4",8);
  builtin_strncpy(local_1d8,"-123.45",8);
  builtin_strncpy(local_1a0,"+123.45",8);
  builtin_strncpy(local_200,"123.45",7);
  builtin_strncpy(local_1f8,"12345",6);
  local_1e0 = 0x302e3534333231;
  builtin_strncpy(local_1b0,"000123.45",10);
  builtin_strncpy(local_208,"123.45",7);
  builtin_strncpy(local_1c0,"123.45000",10);
  builtin_strncpy(local_210,"123.45",7);
  local_1d0 = 0x35343332312e3030;
  local_1c8 = 0;
  builtin_strncpy(local_1e8,"0.12345",8);
  builtin_strncpy(local_1f0,"123.00",7);
  builtin_strncpy(local_228,"123.0",6);
  local_248 = (char *)((ulong)local_248 & 0xffffffff00000000);
  local_258.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_128,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_258.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_128,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_258.fUnicodeForm,dt_decimal,(Status *)&local_248,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_258);
  if (cVar2 == '\0') {
    StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x336,local_128,local_258.fLocalForm,1);
    StrX::~StrX(&local_258);
    errSeen = 1;
  }
  local_248 = (char *)((ulong)local_248 & 0xffffffff00000000);
  local_258.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_178,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_258.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_178,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_258.fUnicodeForm,dt_decimal,(Status *)&local_248,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_258);
  if (cVar2 == '\0') {
    StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x337,local_178,local_258.fLocalForm,1);
    StrX::~StrX(&local_258);
    errSeen = 1;
  }
  local_248 = (char *)((ulong)local_248 & 0xffffffff00000000);
  local_258.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         ((char *)&local_198,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_258.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ((char *)&local_198,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_258.fUnicodeForm,dt_decimal,(Status *)&local_248,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_258);
  if (cVar2 == '\0') {
    StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x338,&local_198,local_258.fLocalForm,1);
    StrX::~StrX(&local_258);
    errSeen = 1;
  }
  local_248 = (char *)((ulong)local_248 & 0xffffffff00000000);
  local_258.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_158,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_258.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_158,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_258.fUnicodeForm,dt_decimal,(Status *)&local_248,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_258);
  if (cVar2 == '\0') {
    StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x339,local_158,local_258.fLocalForm,1);
    StrX::~StrX(&local_258);
    errSeen = 1;
  }
  local_248 = (char *)((ulong)local_248 & 0xffffffff00000000);
  local_258.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_118,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_258.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_118,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_258.fUnicodeForm,dt_decimal,(Status *)&local_248,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_258);
  if (cVar2 == '\0') {
    StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x33a,local_118,local_258.fLocalForm,1);
    StrX::~StrX(&local_258);
    errSeen = 1;
  }
  local_248 = (char *)((ulong)local_248 & 0xffffffff00000000);
  local_258.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_238,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_258.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_238,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_258.fUnicodeForm,dt_decimal,(Status *)&local_248,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_258);
  if (cVar2 == '\0') {
    if ((int)local_248 != 6) {
      StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
      if (((ulong)local_248 & 0xffffffff) < 0xb) {
        pcVar10 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_248 & 0xffffffff];
      }
      else {
        pcVar10 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x33d,local_238,local_258.fLocalForm,"st_FOCA0002",pcVar10);
      goto LAB_00103b34;
    }
  }
  else {
    StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x33d,local_238,local_258.fLocalForm,0);
LAB_00103b34:
    StrX::~StrX(&local_258);
    errSeen = 1;
  }
  local_248 = (char *)((ulong)local_248 & 0xffffffff00000000);
  local_258.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_220,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_258.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_220,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_258.fUnicodeForm,dt_decimal,(Status *)&local_248,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_258);
  if (cVar2 == '\0') {
    if ((int)local_248 == 6) goto LAB_00103c46;
    StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
    if (((ulong)local_248 & 0xffffffff) < 0xb) {
      pcVar10 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_248 & 0xffffffff];
    }
    else {
      pcVar10 = "st_UnknownType";
    }
    printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
           ,0x33e,local_220,local_258.fLocalForm,"st_FOCA0002",pcVar10);
  }
  else {
    StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x33e,local_220,local_258.fLocalForm,0);
  }
  StrX::~StrX(&local_258);
  errSeen = 1;
LAB_00103c46:
  iVar11 = 1;
  do {
    local_248 = (char *)((ulong)local_248 & 0xffffffff00000000);
    local_258.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_128,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_258.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_128,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar9 = (void *)0x2;
    pXVar4 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_258.fUnicodeForm,dt_decimal,(Status *)&local_248,ver_10,iVar11 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_258);
    if (pXVar4 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x35b,local_128);
      StrX::~StrX(&local_258);
      errSeen = 1;
    }
    else {
      uStack_98 = 0x40934a449ba5e354;
      local_80 = local_38;
      local_90 = local_48;
      uStack_88 = uStack_40;
      expValue.fValue.f_strVal = (XMLCh *)0x40934a449ba5e354;
      expValue._0_8_ = local_a0;
      expValue.fValue._8_8_ = local_48;
      expValue.fValue._16_8_ = uStack_40;
      expValue.fValue.f_datetime.f_milisec = (double)local_38;
      bVar3 = compareActualValue(dt_decimal,*pXVar4,expValue);
      if (!bVar3) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar9);
    }
    local_248 = (char *)((ulong)local_248 & 0xffffffff00000000);
    local_258.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_178,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_258.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_178,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar9 = (void *)0x2;
    pXVar4 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_258.fUnicodeForm,dt_decimal,(Status *)&local_248,ver_10,iVar11 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_258);
    if (pXVar4 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x35d,local_178);
      StrX::~StrX(&local_258);
      errSeen = 1;
    }
    else {
      uStack_c0 = 0x43f0000000000000;
      local_a8 = local_50;
      local_b8 = local_60;
      uStack_b0 = uStack_58;
      expValue_00.fValue.f_strVal = (XMLCh *)0x43f0000000000000;
      expValue_00._0_8_ = local_c8;
      expValue_00.fValue._8_8_ = local_60;
      expValue_00.fValue._16_8_ = uStack_58;
      expValue_00.fValue.f_datetime.f_milisec = (double)local_50;
      bVar3 = compareActualValue(dt_decimal,*pXVar4,expValue_00);
      if (!bVar3) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar9);
    }
    local_248 = (char *)((ulong)local_248 & 0xffffffff00000000);
    local_258.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           ((char *)&local_198,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_258.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ((char *)&local_198,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar9 = (void *)0x2;
    pXVar4 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_258.fUnicodeForm,dt_decimal,(Status *)&local_248,ver_10,iVar11 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_258);
    if (pXVar4 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x35e,&local_198);
      StrX::~StrX(&local_258);
      errSeen = 1;
    }
    else {
      uStack_e8 = 0x408f3979ca10c924;
      local_d0 = local_68;
      local_e0 = local_78;
      uStack_d8 = uStack_70;
      expValue_01.fValue.f_strVal = (XMLCh *)0x408f3979ca10c924;
      expValue_01._0_8_ = local_f0;
      expValue_01.fValue._8_8_ = local_78;
      expValue_01.fValue._16_8_ = uStack_70;
      expValue_01.fValue.f_datetime.f_milisec = (double)local_68;
      bVar3 = compareActualValue(dt_decimal,*pXVar4,expValue_01);
      if (!bVar3) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar9);
    }
    local_248 = (char *)((ulong)local_248 & 0xffffffff00000000);
    local_258.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_238,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_258.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_238,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_258.fUnicodeForm,dt_decimal,(Status *)&local_248,ver_10,iVar11 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_258);
    if (pXVar5 == (XSValue *)0x0) {
      if ((int)local_248 != 6) {
        StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
        pcVar10 = "st_UnknownType";
        if (((ulong)local_248 & 0xffffffff) < 0xb) {
          pcVar10 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_248 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x362,local_238,local_258.fLocalForm,"st_FOCA0002",pcVar10);
        StrX::~StrX(&local_258);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
      pvVar9 = (void *)0x362;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x362,local_238);
      StrX::~StrX(&local_258);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar9);
    }
    local_248 = (char *)((ulong)local_248 & 0xffffffff00000000);
    local_258.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_220,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_258.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_220,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_258.fUnicodeForm,dt_decimal,(Status *)&local_248,ver_10,iVar11 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_258);
    if (pXVar5 == (XSValue *)0x0) {
      if ((int)local_248 != 6) {
        StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
        pcVar10 = "st_UnknownType";
        if (((ulong)local_248 & 0xffffffff) < 0xb) {
          pcVar10 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_248 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x363,local_220,local_258.fLocalForm,"st_FOCA0002",pcVar10);
        StrX::~StrX(&local_258);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
      pvVar9 = (void *)0x363;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x363,local_220);
      StrX::~StrX(&local_258);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar9);
    }
    iVar11 = iVar11 + -1;
  } while (iVar11 == 0);
  iVar11 = 0;
  do {
    local_23c = st_Init;
    local_258.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_138,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_258.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_138,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar6 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_258.fUnicodeForm,dt_decimal,&local_23c,ver_10,iVar11 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_258);
    if (pwVar6 == (wchar16 *)0x0) {
      StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x381,local_138);
      StrX::~StrX(&local_258);
      errSeen = 1;
    }
    else {
      local_248 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar10 = local_1d8;
      if (local_248 != pcVar10) {
        pcVar7 = local_248;
        if (local_248 == (char *)0x0) {
LAB_0010433a:
          if (*pcVar10 == '\0') goto LAB_0010438a;
        }
        else {
          do {
            cVar2 = *pcVar7;
            if (cVar2 == '\0') goto LAB_0010433a;
            pcVar7 = pcVar7 + 1;
            cVar1 = *pcVar10;
            pcVar10 = pcVar10 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x381,local_138,local_258.fLocalForm,local_248,local_1d8);
        StrX::~StrX(&local_258);
        errSeen = 1;
      }
LAB_0010438a:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar6);
      xercesc_4_0::XMLString::release(&local_248,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_23c = st_Init;
    local_258.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_1a0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_258.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_1a0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar6 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_258.fUnicodeForm,dt_decimal,&local_23c,ver_10,iVar11 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_258);
    if (pwVar6 == (wchar16 *)0x0) {
      StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x382,local_1a0);
      StrX::~StrX(&local_258);
      errSeen = 1;
    }
    else {
      local_248 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar10 = local_200;
      if (local_248 != pcVar10) {
        pcVar7 = local_248;
        if (local_248 == (char *)0x0) {
LAB_00104489:
          if (*pcVar10 == '\0') goto LAB_001044d9;
        }
        else {
          do {
            cVar2 = *pcVar7;
            if (cVar2 == '\0') goto LAB_00104489;
            pcVar7 = pcVar7 + 1;
            cVar1 = *pcVar10;
            pcVar10 = pcVar10 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x382,local_1a0,local_258.fLocalForm,local_248,local_200);
        StrX::~StrX(&local_258);
        errSeen = 1;
      }
LAB_001044d9:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar6);
      xercesc_4_0::XMLString::release(&local_248,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_23c = st_Init;
    local_258.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_1f8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_258.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_1f8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar6 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_258.fUnicodeForm,dt_decimal,&local_23c,ver_10,iVar11 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_258);
    if (pwVar6 == (wchar16 *)0x0) {
      StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,899,local_1f8);
      StrX::~StrX(&local_258);
      errSeen = 1;
    }
    else {
      local_248 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar10 = (char *)&local_1e0;
      if (local_248 != pcVar10) {
        pcVar7 = local_248;
        if (local_248 == (char *)0x0) {
LAB_001045d8:
          if (*pcVar10 == '\0') goto LAB_00104628;
        }
        else {
          do {
            cVar2 = *pcVar7;
            if (cVar2 == '\0') goto LAB_001045d8;
            pcVar7 = pcVar7 + 1;
            cVar1 = *pcVar10;
            pcVar10 = pcVar10 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,899,local_1f8,local_258.fLocalForm,local_248,&local_1e0);
        StrX::~StrX(&local_258);
        errSeen = 1;
      }
LAB_00104628:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar6);
      xercesc_4_0::XMLString::release(&local_248,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_23c = st_Init;
    local_258.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_1b0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_258.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_1b0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar6 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_258.fUnicodeForm,dt_decimal,&local_23c,ver_10,iVar11 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_258);
    if (pwVar6 == (wchar16 *)0x0) {
      StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,900,local_1b0);
      StrX::~StrX(&local_258);
      errSeen = 1;
    }
    else {
      local_248 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar10 = local_208;
      if (local_248 != pcVar10) {
        pcVar7 = local_248;
        if (local_248 == (char *)0x0) {
LAB_00104727:
          if (*pcVar10 == '\0') goto LAB_00104777;
        }
        else {
          do {
            cVar2 = *pcVar7;
            if (cVar2 == '\0') goto LAB_00104727;
            pcVar7 = pcVar7 + 1;
            cVar1 = *pcVar10;
            pcVar10 = pcVar10 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,900,local_1b0,local_258.fLocalForm,local_248,local_208);
        StrX::~StrX(&local_258);
        errSeen = 1;
      }
LAB_00104777:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar6);
      xercesc_4_0::XMLString::release(&local_248,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_23c = st_Init;
    local_258.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_1c0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_258.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_1c0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar6 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_258.fUnicodeForm,dt_decimal,&local_23c,ver_10,iVar11 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_258);
    if (pwVar6 == (wchar16 *)0x0) {
      StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x385,local_1c0);
      StrX::~StrX(&local_258);
      errSeen = 1;
    }
    else {
      local_248 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar10 = local_210;
      if (local_248 != pcVar10) {
        pcVar7 = local_248;
        if (local_248 == (char *)0x0) {
LAB_00104876:
          if (*pcVar10 == '\0') goto LAB_001048c6;
        }
        else {
          do {
            cVar2 = *pcVar7;
            if (cVar2 == '\0') goto LAB_00104876;
            pcVar7 = pcVar7 + 1;
            cVar1 = *pcVar10;
            pcVar10 = pcVar10 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x385,local_1c0,local_258.fLocalForm,local_248,local_210);
        StrX::~StrX(&local_258);
        errSeen = 1;
      }
LAB_001048c6:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar6);
      xercesc_4_0::XMLString::release(&local_248,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_23c = st_Init;
    local_258.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           ((char *)&local_1d0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_258.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ((char *)&local_1d0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar6 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_258.fUnicodeForm,dt_decimal,&local_23c,ver_10,iVar11 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_258);
    if (pwVar6 == (wchar16 *)0x0) {
      StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x386,&local_1d0);
      StrX::~StrX(&local_258);
      errSeen = 1;
    }
    else {
      local_248 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar10 = local_1e8;
      if (local_248 != pcVar10) {
        pcVar7 = local_248;
        if (local_248 == (char *)0x0) {
LAB_001049c5:
          if (*pcVar10 == '\0') goto LAB_00104a15;
        }
        else {
          do {
            cVar2 = *pcVar7;
            if (cVar2 == '\0') goto LAB_001049c5;
            pcVar7 = pcVar7 + 1;
            cVar1 = *pcVar10;
            pcVar10 = pcVar10 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x386,&local_1d0,local_258.fLocalForm,local_248,local_1e8);
        StrX::~StrX(&local_258);
        errSeen = 1;
      }
LAB_00104a15:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar6);
      xercesc_4_0::XMLString::release(&local_248,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_23c = st_Init;
    local_258.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_1f0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_258.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_1f0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar6 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_258.fUnicodeForm,dt_decimal,&local_23c,ver_10,iVar11 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_258);
    if (pwVar6 == (wchar16 *)0x0) {
      StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x387,local_1f0);
      StrX::~StrX(&local_258);
      errSeen = 1;
    }
    else {
      local_248 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar10 = local_228;
      if (local_248 != pcVar10) {
        pcVar7 = local_248;
        if (local_248 == (char *)0x0) {
LAB_00104b14:
          if (*pcVar10 == '\0') goto LAB_00104b64;
        }
        else {
          do {
            cVar2 = *pcVar7;
            if (cVar2 == '\0') goto LAB_00104b14;
            pcVar7 = pcVar7 + 1;
            cVar1 = *pcVar10;
            pcVar10 = pcVar10 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x387,local_1f0,local_258.fLocalForm,local_248,local_228);
        StrX::~StrX(&local_258);
        errSeen = 1;
      }
LAB_00104b64:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar6);
      xercesc_4_0::XMLString::release(&local_248,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_23c = st_Init;
    local_258.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_178,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_258.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_178,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar6 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_258.fUnicodeForm,dt_decimal,&local_23c,ver_10,iVar11 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_258);
    if (pwVar6 == (wchar16 *)0x0) {
      StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x389,local_178);
      StrX::~StrX(&local_258);
      errSeen = 1;
    }
    else {
      local_248 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar10 = local_178;
      if (local_248 != pcVar10) {
        pcVar7 = local_248;
        if (local_248 == (char *)0x0) {
LAB_00104c63:
          if (*pcVar10 == '\0') goto LAB_00104cae;
        }
        else {
          do {
            cVar2 = *pcVar7;
            if (cVar2 == '\0') goto LAB_00104c63;
            pcVar7 = pcVar7 + 1;
            cVar1 = *pcVar10;
            pcVar10 = pcVar10 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x389,local_178,local_258.fLocalForm,local_248,local_178);
        StrX::~StrX(&local_258);
        errSeen = 1;
      }
LAB_00104cae:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar6);
      xercesc_4_0::XMLString::release(&local_248,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_23c = st_Init;
    local_258.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           ((char *)&local_198,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_258.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ((char *)&local_198,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar6 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_258.fUnicodeForm,dt_decimal,&local_23c,ver_10,iVar11 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_258);
    if (pwVar6 == (wchar16 *)0x0) {
      StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x38a,&local_198);
      StrX::~StrX(&local_258);
      errSeen = 1;
    }
    else {
      local_248 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar10 = (char *)&local_198;
      if (local_248 != pcVar10) {
        pcVar7 = local_248;
        if (local_248 == (char *)0x0) {
LAB_00104dad:
          if (*pcVar10 == '\0') goto LAB_00104df8;
        }
        else {
          do {
            cVar2 = *pcVar7;
            if (cVar2 == '\0') goto LAB_00104dad;
            pcVar7 = pcVar7 + 1;
            cVar1 = *pcVar10;
            pcVar10 = pcVar10 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x38a,&local_198,local_258.fLocalForm,local_248,&local_198);
        StrX::~StrX(&local_258);
        errSeen = 1;
      }
LAB_00104df8:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar6);
      xercesc_4_0::XMLString::release(&local_248,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_23c = st_Init;
    local_258.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_158,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_258.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_158,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar6 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_258.fUnicodeForm,dt_decimal,&local_23c,ver_10,iVar11 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_258);
    if (pwVar6 == (wchar16 *)0x0) {
      StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x38b,local_158);
      StrX::~StrX(&local_258);
      errSeen = 1;
    }
    else {
      local_248 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar10 = local_158;
      if (local_248 != pcVar10) {
        pcVar7 = local_248;
        if (local_248 == (char *)0x0) {
LAB_00104efc:
          if (*pcVar10 == '\0') goto LAB_00104f47;
        }
        else {
          do {
            cVar2 = *pcVar7;
            if (cVar2 == '\0') goto LAB_00104efc;
            pcVar7 = pcVar7 + 1;
            cVar1 = *pcVar10;
            pcVar10 = pcVar10 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x38b,local_158,local_258.fLocalForm,local_248,local_158);
        StrX::~StrX(&local_258);
        errSeen = 1;
      }
LAB_00104f47:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar6);
      xercesc_4_0::XMLString::release(&local_248,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_23c = st_Init;
    local_258.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_118,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_258.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_118,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar6 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_258.fUnicodeForm,dt_decimal,&local_23c,ver_10,iVar11 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_258);
    if (pwVar6 == (wchar16 *)0x0) {
      StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x38c,local_118);
      StrX::~StrX(&local_258);
      errSeen = 1;
    }
    else {
      local_248 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (local_248 != local_118) {
        pcVar10 = local_248;
        pcVar7 = local_118;
        if (local_248 == (char *)0x0) {
LAB_00105034:
          if (*pcVar7 == '\0') goto LAB_0010507a;
        }
        else {
          do {
            cVar2 = *pcVar10;
            if (cVar2 == '\0') goto LAB_00105034;
            cVar1 = *pcVar7;
            pcVar10 = pcVar10 + 1;
            pcVar7 = pcVar7 + 1;
          } while (cVar2 == cVar1);
        }
        StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x38c,local_118,local_258.fLocalForm,local_248,local_118);
        StrX::~StrX(&local_258);
        errSeen = 1;
      }
LAB_0010507a:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar6);
      xercesc_4_0::XMLString::release(&local_248,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_248 = (char *)((ulong)local_248 & 0xffffffff00000000);
    local_258.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_238,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_258.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_238,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar8 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_258.fUnicodeForm,dt_decimal,(Status *)&local_248,ver_10,iVar11 == 0,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_258);
    if (lVar8 == 0) {
      if ((int)local_248 != 6) {
        StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
        pcVar10 = "st_UnknownType";
        if (((ulong)local_248 & 0xffffffff) < 0xb) {
          pcVar10 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_248 & 0xffffffff];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x38d,local_238,local_258.fLocalForm,"st_FOCA0002",pcVar10);
        StrX::~StrX(&local_258);
        goto LAB_00105195;
      }
    }
    else {
      StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x38d,local_238);
      StrX::~StrX(&local_258);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar8);
LAB_00105195:
      errSeen = 1;
    }
    local_248 = (char *)((ulong)local_248 & 0xffffffff00000000);
    local_258.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_220,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_258.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_220,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar8 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_258.fUnicodeForm,dt_decimal,(Status *)&local_248,ver_10,iVar11 == 0,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_258);
    if (lVar8 == 0) {
      if ((int)local_248 != 6) {
        StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
        pcVar10 = "st_UnknownType";
        if (((ulong)local_248 & 0xffffffff) < 0xb) {
          pcVar10 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_248 & 0xffffffff];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x38e,local_220,local_258.fLocalForm,"st_FOCA0002",pcVar10);
        StrX::~StrX(&local_258);
        goto LAB_001052a7;
      }
    }
    else {
      StrX::StrX(&local_258,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x38e,local_220);
      StrX::~StrX(&local_258);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar8);
LAB_001052a7:
      errSeen = 1;
    }
    bVar3 = iVar11 != 0;
    iVar11 = iVar11 + 1;
    if (bVar3) {
      return;
    }
  } while( true );
}

Assistant:

void test_dt_decimal()
{
    const XSValue::DataType dt = XSValue::dt_decimal;
    bool  toValidate = true;

    const char lex_v_ran_v_1[]="  1234.567  \n";
    const char lex_v_ran64_v_1[]="18446744073709551615.999";
    const char lex_v_ran64_v_2[]="999.18446744073709551615";
    const char lex_v_ran64_iv_1[]="18446744073709551616.999";
    const char lex_v_ran64_iv_2[]="999.18446744073709551616";

    const char lex_iv_1[]="12b34.456";
    const char lex_iv_2[]="1234.56.789";

    XSValue::XSValue_Data act_v_ran_v_1;   act_v_ran_v_1.fValue.f_double = (double)1234.567;
    XSValue::XSValue_Data act_v_ran64_v_1; act_v_ran64_v_1.fValue.f_double = (double)18446744073709551615.999;
    XSValue::XSValue_Data act_v_ran64_v_2; act_v_ran64_v_2.fValue.f_double = (double)999.18446744073709551615;
    //XSValue::XSValue_Data act_v_ran64_iv_1;="18446744073709551616.999";
    //XSValue::XSValue_Data act_v_ran64_iv_2;="999.18446744073709551616";

    XSValue::XSValue_Data act_v_ran32_v_1; act_v_ran32_v_1.fValue.f_double = (double)4294967295.999;
    XSValue::XSValue_Data act_v_ran32_v_2; act_v_ran32_v_2.fValue.f_double = (double)999.4294967295;
    //XSValue::XSValue_Data act_v_ran32_iv_1;="4294967296.999";
    //XSValue::XSValue_Data act_v_ran32_iv_2;="999.4294967296";

/***
 * 3.2.3.2 Canonical representation
 *
 * The canonical representation for decimal is defined by prohibiting certain options from the Lexical
 * representation (3.2.3.1). Specifically,
 * 1. the preceding optional "+" sign is prohibited.
 * 2. The decimal point is required.
 * 3. Leading and trailing zeroes are prohibited subject to the following:
 *       there must be at least one digit to the right and
 *       to the left of the decimal point which may be a zero.
 ***/

    const char data_rawstr_1[]="  -123.45  \n";
    const char data_canrep_1[]="-123.45";
    const char data_rawstr_2[]="+123.45";
    const char data_canrep_2[]="123.45";
    const char data_rawstr_3[]="12345";
    const char data_canrep_3[]="12345.0";
    const char data_rawstr_4[]="000123.45";
    const char data_canrep_4[]="123.45";
    const char data_rawstr_5[]="123.45000";
    const char data_canrep_5[]="123.45";
    const char data_rawstr_6[]="00.12345";
    const char data_canrep_6[]="0.12345";
    const char data_rawstr_7[]="123.00";
    const char data_canrep_7[]="123.0";

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *    lexical valid
     *            range  valid                           true              n/a
     *            range  invalid       n/a
     *    lexical invalid                                false           st_FOCA0002
     *
     ***/

    // lexical valid
    VALIDATE_TEST(lex_v_ran_v_1    , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran64_v_1  , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran64_v_2  , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran64_iv_1 , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran64_iv_2 , dt, EXP_RET_VALID_TRUE, DONT_CARE);

    // lexical invalid
    VALIDATE_TEST(lex_iv_1         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(lex_iv_2         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        ACTVALUE_TEST(lex_v_ran_v_1,    dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_1);

        ACTVALUE_TEST(lex_v_ran64_v_1 , dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran64_v_1);
        ACTVALUE_TEST(lex_v_ran64_v_2 , dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran64_v_2);
        //ACTVALUE_TEST(lex_v_ran64_iv_1, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0001);
        //ACTVALUE_TEST(lex_v_ran64_iv_2, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0001);

        ACTVALUE_TEST(lex_iv_1,         dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran32_v_1);
        ACTVALUE_TEST(lex_iv_2,         dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran32_v_1);
    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XMLCh          n/a
     *          range  invalid          n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XMLCh         n/a
     *          range  invalid          n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j)? true : false;

        CANREP_TEST(data_rawstr_1,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_1,    DONT_CARE);
        CANREP_TEST(data_rawstr_2,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_2,    DONT_CARE);
        CANREP_TEST(data_rawstr_3,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_3,    DONT_CARE);
        CANREP_TEST(data_rawstr_4,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_4,    DONT_CARE);
        CANREP_TEST(data_rawstr_5,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_5,    DONT_CARE);
        CANREP_TEST(data_rawstr_6,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_6,    DONT_CARE);
        CANREP_TEST(data_rawstr_7,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_7,    DONT_CARE);

        CANREP_TEST(lex_v_ran64_v_1,  dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran64_v_1,  DONT_CARE);
        CANREP_TEST(lex_v_ran64_v_2,  dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran64_v_2,  DONT_CARE);
        CANREP_TEST(lex_v_ran64_iv_1, dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran64_iv_1, DONT_CARE);
        CANREP_TEST(lex_v_ran64_iv_2, dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran64_iv_2, DONT_CARE);
        CANREP_TEST(lex_iv_1        , dt, toValidate, EXP_RET_CANREP_FALSE, null_string,                XSValue::st_FOCA0002);
        CANREP_TEST(lex_iv_2        , dt, toValidate, EXP_RET_CANREP_FALSE, null_string,                XSValue::st_FOCA0002);

    }

}